

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

int __thiscall cmCTestSubmitHandler::ProcessHandler(cmCTestSubmitHandler *this)

{
  string *psVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  cmValue file;
  cmValue typeString;
  char *pcVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  iterator __first;
  string *gfile;
  pointer pbVar8;
  Part p;
  long lVar9;
  char *pcVar10;
  string local_4d8;
  string url;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gfiles;
  ostringstream cmCTestLog_msg_2;
  string local_2d8;
  string prefix;
  cmGeneratedFileStream ofs;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,"CDashUploadFile",(allocator<char> *)&cmCTestLog_msg_2);
  file = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,"CDashUploadType",(allocator<char> *)&cmCTestLog_msg_2);
  typeString = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  if (typeString.Value != (string *)0x0 && file.Value != (string *)0x0) {
    iVar5 = HandleCDashUploadFile(this,file.Value,typeString.Value);
    return iVar5;
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,"BuildDirectory",(allocator<char> *)&cmCTestLog_msg_2);
  cmCTest::GetCTestConfiguration(&local_2d8,pcVar2,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  if (local_2d8._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar7 = std::operator<<((ostream *)&ofs,
                             "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x2d9,_cmCTestLog_msg_2,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
    iVar5 = -1;
    goto LAB_001c2d37;
  }
  pcVar6 = getenv("HTTP_PROXY");
  if (pcVar6 != (char *)0x0) {
    this->HTTPProxyType = 1;
    psVar1 = &this->HTTPProxy;
    std::__cxx11::string::assign((char *)psVar1);
    pcVar6 = getenv("HTTP_PROXY_PORT");
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::append((char *)psVar1);
      getenv("HTTP_PROXY_PORT");
      std::__cxx11::string::append((char *)psVar1);
    }
    pcVar6 = getenv("HTTP_PROXY_TYPE");
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofs,pcVar6,(allocator<char> *)&cmCTestLog_msg_2);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ofs,"HTTP");
      if (bVar4) {
        iVar5 = 1;
LAB_001c21a8:
        this->HTTPProxyType = iVar5;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ofs,"SOCKS4");
        if (bVar4) {
          iVar5 = 2;
          goto LAB_001c21a8;
        }
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ofs,"SOCKS5");
        if (bVar4) {
          iVar5 = 3;
          goto LAB_001c21a8;
        }
      }
      std::__cxx11::string::~string((string *)&ofs);
    }
    pcVar6 = getenv("HTTP_PROXY_USER");
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->HTTPProxyAuth);
    }
    pcVar6 = getenv("HTTP_PROXY_PASSWD");
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
      getenv("HTTP_PROXY_PASSWD");
      std::__cxx11::string::append((char *)&this->HTTPProxyAuth);
    }
  }
  if ((this->HTTPProxy)._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar7 = std::operator<<((ostream *)&ofs,"   Use HTTP Proxy: ");
    poVar7 = std::operator<<(poVar7,(string *)&this->HTTPProxy);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x2fb,_cmCTestLog_msg_2,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
  cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Submit",&ofs);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSubmitResultsPrefix_abi_cxx11_(&prefix,this);
  if ((this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ::cm::
    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&files,&this->Files);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Update.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartUpdate,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Configure.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartConfigure,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Build.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartBuild,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Test.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartTest,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Coverage.xml",(allocator<char> *)&url);
  bVar4 = cmCTest::AddIfExists(pcVar2,PartCoverage,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  if (bVar4) {
    gfiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    gfiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    gfiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg_2,&local_2d8,"/Testing/");
    cmCTest::GetCurrentTag_abi_cxx11_(&local_4d8,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&url,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &cmCTestLog_msg_2,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg_2,&url,"/CoverageLog*");
    std::__cxx11::string::operator=((string *)&url,(string *)&cmCTestLog_msg_2);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_2,"Globbing for: ");
    poVar7 = std::operator<<(poVar7,(string *)&url);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x319,local_4d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
    bVar4 = cmSystemTools::SimpleGlob(&url,&gfiles,1);
    pbVar3 = gfiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar4) {
      for (pbVar8 = gfiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1
          ) {
        std::__cxx11::string::substr((ulong)&cmCTestLog_msg_2,(ulong)pbVar8);
        std::__cxx11::string::operator=((string *)pbVar8,(string *)&cmCTestLog_msg_2);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_2,"Glob file: ");
        poVar7 = std::operator<<(poVar7,(string *)pbVar8);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x31e,local_4d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&local_4d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
        cmCTest::AddSubmitFile((this->super_cmCTestGenericHandler).CTest,PartCoverage,pbVar8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_2,"Problem globbing");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x322,local_4d8._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
    }
    std::__cxx11::string::~string((string *)&url);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&gfiles);
  }
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"DynamicAnalysis.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartMemCheck,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"DynamicAnalysis-Test.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartMemCheck,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Purify.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartMemCheck,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Notes.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartNotes,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_2,"Upload.xml",(allocator<char> *)&url);
  cmCTest::AddIfExists(pcVar2,PartUpload,(string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 1) {
    if (this->SubmitPart[lVar9] == true) {
      r = cmCTest::GetSubmitFiles_abi_cxx11_((this->super_cmCTestGenericHandler).CTest,(Part)lVar9);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&files,r);
    }
  }
  __first = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&files);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&files,(const_iterator)__first._M_current,
          (const_iterator)
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  if (this->SubmitPart[0xb] == true) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files,
               (char (*) [9])"Done.xml");
  }
  if (((&ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    poVar7 = std::operator<<((ostream *)&ofs,"Upload files:");
    std::endl<char,std::char_traits<char>>(poVar7);
    pbVar3 = files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = 0;
    for (pbVar8 = files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1)
    {
      poVar7 = (ostream *)std::ostream::operator<<(&ofs,iVar5);
      poVar7 = std::operator<<(poVar7,"\t");
      poVar7 = std::operator<<(poVar7,(string *)pbVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      iVar5 = iVar5 + 1;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
  std::operator<<((ostream *)&cmCTestLog_msg_2,"Submit files\n");
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x34e,url._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
  pcVar6 = cmCTest::GetSpecificGroup((this->super_cmCTestGenericHandler).CTest);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_2,"   Send to group: ");
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x353,url._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&url);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
  }
  this->LogFile = (ostream *)&ofs;
  cmCTest::GetSubmitURL_abi_cxx11_(&url,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
  poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_2,"   SubmitURL: ");
  poVar7 = std::operator<<(poVar7,(string *)&url);
  std::operator<<(poVar7,'\n');
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
               ,0x359,local_4d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
  std::operator+(&local_4d8,&local_2d8,"/Testing/");
  cmCTest::GetCurrentTag_abi_cxx11_((string *)&gfiles,(this->super_cmCTestGenericHandler).CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_2,&local_4d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gfiles);
  bVar4 = SubmitUsingHTTP(this,(string *)&cmCTestLog_msg_2,&files,&prefix,&url);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_2);
  std::__cxx11::string::~string((string *)&gfiles);
  std::__cxx11::string::~string((string *)&local_4d8);
  if (bVar4) {
    if (this->HasErrors == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
      std::operator<<((ostream *)&cmCTestLog_msg_2,"   Errors occurred during submission.\n");
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      iVar5 = 0;
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x364,local_4d8._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
      std::operator<<((ostream *)&ofs,"   Errors occurred during submission.\n");
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_2,"   Submission successful");
      pcVar10 = "";
      pcVar6 = "";
      if (this->HasWarnings != false) {
        pcVar6 = ", with warnings.";
      }
      poVar7 = std::operator<<(poVar7,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x36b,local_4d8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
      poVar7 = std::operator<<((ostream *)&ofs,"   Submission successful");
      if (this->HasWarnings != false) {
        pcVar10 = ", with warnings.";
      }
      poVar7 = std::operator<<(poVar7,pcVar10);
      iVar5 = 0;
      std::endl<char,std::char_traits<char>>(poVar7);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_2);
    std::operator<<((ostream *)&cmCTestLog_msg_2,"   Problems when submitting via HTTP\n");
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x35e,local_4d8._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_2);
    std::operator<<((ostream *)&ofs,"   Problems when submitting via HTTP\n");
    iVar5 = -1;
  }
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&prefix);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
LAB_001c2d37:
  std::__cxx11::string::~string((string *)&local_2d8);
  return iVar5;
}

Assistant:

int cmCTestSubmitHandler::ProcessHandler()
{
  cmValue cdashUploadFile = this->GetOption("CDashUploadFile");
  cmValue cdashUploadType = this->GetOption("CDashUploadType");
  if (cdashUploadFile && cdashUploadType) {
    return this->HandleCDashUploadFile(cdashUploadFile, cdashUploadType);
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  if (char const* proxy = getenv("HTTP_PROXY")) {
    this->HTTPProxyType = 1;
    this->HTTPProxy = proxy;
    if (getenv("HTTP_PROXY_PORT")) {
      this->HTTPProxy += ":";
      this->HTTPProxy += getenv("HTTP_PROXY_PORT");
    }
    if (char const* proxy_type = getenv("HTTP_PROXY_TYPE")) {
      std::string type = proxy_type;
      // HTTP/SOCKS4/SOCKS5
      if (type == "HTTP") {
        this->HTTPProxyType = 1;
      } else if (type == "SOCKS4") {
        this->HTTPProxyType = 2;
      } else if (type == "SOCKS5") {
        this->HTTPProxyType = 3;
      }
    }
    if (getenv("HTTP_PROXY_USER")) {
      this->HTTPProxyAuth = getenv("HTTP_PROXY_USER");
    }
    if (getenv("HTTP_PROXY_PASSWD")) {
      this->HTTPProxyAuth += ":";
      this->HTTPProxyAuth += getenv("HTTP_PROXY_PASSWD");
    }
  }

  if (!this->HTTPProxy.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Use HTTP Proxy: " << this->HTTPProxy << std::endl,
                       this->Quiet);
  }
  cmGeneratedFileStream ofs;
  this->StartLogFile("Submit", ofs);

  std::vector<std::string> files;
  std::string prefix = this->GetSubmitResultsPrefix();

  if (!this->Files.empty()) {
    // Submit the explicitly selected files:
    cm::append(files, this->Files);
  }

  // Add to the list of files to submit from any selected, existing parts:
  //

  // TODO:
  // Check if test is enabled

  this->CTest->AddIfExists(cmCTest::PartUpdate, "Update.xml");
  this->CTest->AddIfExists(cmCTest::PartConfigure, "Configure.xml");
  this->CTest->AddIfExists(cmCTest::PartBuild, "Build.xml");
  this->CTest->AddIfExists(cmCTest::PartTest, "Test.xml");
  if (this->CTest->AddIfExists(cmCTest::PartCoverage, "Coverage.xml")) {
    std::vector<std::string> gfiles;
    std::string gpath =
      buildDirectory + "/Testing/" + this->CTest->GetCurrentTag();
    std::string::size_type glen = gpath.size() + 1;
    gpath = gpath + "/CoverageLog*";
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Globbing for: " << gpath << std::endl, this->Quiet);
    if (cmSystemTools::SimpleGlob(gpath, gfiles, 1)) {
      for (std::string& gfile : gfiles) {
        gfile = gfile.substr(glen);
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "Glob file: " << gfile << std::endl, this->Quiet);
        this->CTest->AddSubmitFile(cmCTest::PartCoverage, gfile);
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Problem globbing" << std::endl);
    }
  }
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "DynamicAnalysis.xml");
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "DynamicAnalysis-Test.xml");
  this->CTest->AddIfExists(cmCTest::PartMemCheck, "Purify.xml");
  this->CTest->AddIfExists(cmCTest::PartNotes, "Notes.xml");
  this->CTest->AddIfExists(cmCTest::PartUpload, "Upload.xml");

  // Query parts for files to submit.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    // Skip parts we are not submitting.
    if (!this->SubmitPart[p]) {
      continue;
    }

    // Submit files from this part.
    cm::append(files, this->CTest->GetSubmitFiles(p));
  }

  // Make sure files are unique, but preserve order.
  {
    // This endPos intermediate is needed to work around non-conformant C++11
    // standard libraries that have erase(iterator,iterator) instead of
    // erase(const_iterator,const_iterator).
    size_t endPos = cmRemoveDuplicates(files) - files.cbegin();
    files.erase(files.begin() + endPos, files.end());
  }

  // Submit Done.xml last
  if (this->SubmitPart[cmCTest::PartDone]) {
    files.emplace_back("Done.xml");
  }

  if (ofs) {
    ofs << "Upload files:" << std::endl;
    int cnt = 0;
    for (std::string const& file : files) {
      ofs << cnt << "\t" << file << std::endl;
      cnt++;
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Submit files\n",
                     this->Quiet);
  const char* specificGroup = this->CTest->GetSpecificGroup();
  if (specificGroup) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Send to group: " << specificGroup << std::endl,
                       this->Quiet);
  }
  this->SetLogFile(&ofs);

  std::string url = this->CTest->GetSubmitURL();
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   SubmitURL: " << url << '\n', this->Quiet);
  if (!this->SubmitUsingHTTP(buildDirectory + "/Testing/" +
                               this->CTest->GetCurrentTag(),
                             files, prefix, url)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   Problems when submitting via HTTP\n");
    ofs << "   Problems when submitting via HTTP\n";
    return -1;
  }
  if (this->HasErrors) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Errors occurred during submission.\n");
    ofs << "   Errors occurred during submission.\n";
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Submission successful"
                         << (this->HasWarnings ? ", with warnings." : "")
                         << std::endl,
                       this->Quiet);
    ofs << "   Submission successful"
        << (this->HasWarnings ? ", with warnings." : "") << std::endl;
  }

  return 0;
}